

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O3

bool P_LineOpening_3dMidtex(AActor *thing,line_t *linedef,FLineOpening *open,bool restrict)

{
  uint uVar1;
  bool bVar2;
  unsigned_short uVar3;
  double dVar4;
  double tb;
  double tt;
  double local_38;
  double local_30;
  
  if (((linedef->flags & 0x10000000) == 0) ||
     ((((thing->flags).Value & 0x10000) == 0 && (((thing->BounceFlags).Value & 0x1000) == 0)))) {
    open->abovemidtex = false;
    bVar2 = P_GetMidTexturePosition(linedef,0,&local_30,&local_38);
    if (!bVar2) {
      return false;
    }
    dVar4 = (thing->__Pos).Z;
    if ((local_30 + local_38) * 0.5 <= thing->Height * 0.5 + dVar4) {
      if ((local_30 <= dVar4 || !restrict) && (open->bottom <= local_30 && local_30 != open->bottom)
         ) {
        open->bottom = local_30;
        open->abovemidtex = true;
        uVar1 = linedef->sidedef[0]->textures[1].texture.texnum;
        (open->floorpic).texnum = uVar1;
        if ((TerrainTypes.Types.Count <= uVar1) ||
           (uVar3 = TerrainTypes.Types.Array[(int)uVar1],
           TerrainTypes.Types.Array[(int)uVar1] == 0xffff)) {
          uVar3 = DefaultTerrainType;
        }
        open->floorterrain = (uint)uVar3;
        (open->frontfloorplane).normal.X = 0.0;
        (open->frontfloorplane).normal.Y = 0.0;
        (open->frontfloorplane).normal.Z = 1.0;
        (open->frontfloorplane).negiC = -1.0;
        (open->frontfloorplane).D = -local_30;
        (open->backfloorplane).normal.X = 0.0;
        (open->backfloorplane).normal.Y = 0.0;
        (open->backfloorplane).normal.Z = 1.0;
        (open->backfloorplane).negiC = -1.0;
        (open->backfloorplane).D = -local_30;
        dVar4 = (thing->__Pos).Z;
      }
      return ABS(dVar4 - local_30) <= thing->MaxStepHeight;
    }
    if (local_38 < open->top) {
      open->top = local_38;
      (open->ceilingpic).texnum = linedef->sidedef[0]->textures[1].texture.texnum;
    }
  }
  return false;
}

Assistant:

bool P_LineOpening_3dMidtex(AActor *thing, const line_t *linedef, FLineOpening &open, bool restrict)
{
	// [TP] Impassible-like 3dmidtextures do not block missiles
	if ((linedef->flags & ML_3DMIDTEX_IMPASS)
		&& (thing->flags & MF_MISSILE || thing->BounceFlags & BOUNCE_MBF))
	{
		return false;
	}

	double tt, tb;

	open.abovemidtex = false;
	if (P_GetMidTexturePosition(linedef, 0, &tt, &tb))
	{
		if (thing->Center() < (tt + tb)/2)
		{
			if (tb < open.top)
			{
				open.top = tb;
				open.ceilingpic = linedef->sidedef[0]->GetTexture(side_t::mid);
			}
		}
		else
		{
			if (tt > open.bottom && (!restrict || thing->Z() >= tt))
			{
				open.bottom = tt;
				open.abovemidtex = true;
				open.floorpic = linedef->sidedef[0]->GetTexture(side_t::mid);
				open.floorterrain = TerrainTypes[open.floorpic];
				open.frontfloorplane.SetAtHeight(tt, sector_t::floor);
				open.backfloorplane.SetAtHeight(tt, sector_t::floor);

			}
			// returns true if it touches the midtexture
			return (fabs(thing->Z() - tt) <= thing->MaxStepHeight);
		}
	}
	return false;

	/* still have to figure out what this code from Eternity means...
	if((linedef->flags & ML_BLOCKMONSTERS) && 
		!(mo->flags & (MF_FLOAT | MF_DROPOFF)) &&
		fabs(mo->Z() - tt) <= 24)
	{
		opentop = openbottom;
		openrange = 0;
		return;
	}
	*/
}